

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_map_suite.cpp
# Opt level: O3

void api_suite::api_lower_bound(void)

{
  pair<int,_int> *ppVar1;
  pair<int,_int> *ppVar2;
  pair<int,_int> *ppVar3;
  pair<int,_int> *ppVar4;
  pair<int,_int> *ppVar5;
  constant_map<int,_int,_4UL,_std::less<int>_> map;
  constant_map<int,_int,_4UL,_std::less<int>_> cStack_78;
  value_type local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0x300000021;
  uStack_40 = 0x10000000b;
  local_58.first = 0x16;
  local_58.second = 2;
  uStack_50 = 0x40000002c;
  vista::constant_map<int,_int,_4UL,_std::less<int>_>::constant_map
            (&cStack_78,(value_type (*) [4])&local_58);
  ppVar1 = cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems + 2;
  ppVar3 = (pair<int,_int> *)&cStack_78;
  if (cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first < 10) {
    ppVar3 = ppVar1;
  }
  ppVar2 = cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems + 3;
  ppVar5 = cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems + 1;
  ppVar4 = ppVar5;
  if (cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first < 10) {
    ppVar4 = ppVar2;
  }
  boost::detail::test_impl
            ("map.lower_bound(10) == map.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x78,"void api_suite::api_lower_bound()",
             ppVar3 + (ppVar4->first < 10) + (ppVar3[ppVar4->first < 10].first < 10) ==
             (pair<int,_int> *)&cStack_78);
  ppVar4 = ppVar5;
  ppVar3 = (pair<int,_int> *)&cStack_78;
  if (cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first < 0xb) {
    ppVar4 = ppVar2;
    ppVar3 = ppVar1;
  }
  boost::detail::test_impl
            ("map.lower_bound(11) == map.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x79,"void api_suite::api_lower_bound()",
             ppVar3 + (ppVar4->first < 0xb) + (ppVar3[ppVar4->first < 0xb].first < 0xb) ==
             (pair<int,_int> *)&cStack_78);
  ppVar4 = ppVar5;
  ppVar3 = (pair<int,_int> *)&cStack_78;
  if (cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first < 0xc) {
    ppVar4 = ppVar2;
    ppVar3 = ppVar1;
  }
  boost::detail::test_impl
            ("map.lower_bound(12) == map.begin() + 1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7a,"void api_suite::api_lower_bound()",
             ppVar3 + (ppVar4->first < 0xc) + (ppVar3[ppVar4->first < 0xc].first < 0xc) == ppVar5);
  ppVar4 = ppVar5;
  ppVar3 = (pair<int,_int> *)&cStack_78;
  if (cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first < 0x16) {
    ppVar4 = ppVar2;
    ppVar3 = ppVar1;
  }
  boost::detail::test_impl
            ("map.lower_bound(22) == map.begin() + 1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7b,"void api_suite::api_lower_bound()",
             ppVar3 + (ppVar4->first < 0x16) + (ppVar3[ppVar4->first < 0x16].first < 0x16) == ppVar5
            );
  ppVar4 = ppVar5;
  ppVar3 = (pair<int,_int> *)&cStack_78;
  if (cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first < 0x17) {
    ppVar4 = ppVar2;
    ppVar3 = ppVar1;
  }
  boost::detail::test_impl
            ("map.lower_bound(23) == map.begin() + 2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7c,"void api_suite::api_lower_bound()",
             ppVar3 + (ppVar4->first < 0x17) + (ppVar3[ppVar4->first < 0x17].first < 0x17) == ppVar1
            );
  ppVar4 = ppVar5;
  ppVar3 = (pair<int,_int> *)&cStack_78;
  if (cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first < 0x21) {
    ppVar4 = ppVar2;
    ppVar3 = ppVar1;
  }
  boost::detail::test_impl
            ("map.lower_bound(33) == map.begin() + 2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7d,"void api_suite::api_lower_bound()",
             ppVar3 + (ppVar4->first < 0x21) + (ppVar3[ppVar4->first < 0x21].first < 0x21) == ppVar1
            );
  ppVar4 = ppVar5;
  ppVar3 = (pair<int,_int> *)&cStack_78;
  if (cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first < 0x22) {
    ppVar4 = ppVar2;
    ppVar3 = ppVar1;
  }
  boost::detail::test_impl
            ("map.lower_bound(34) == map.begin() + 3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7e,"void api_suite::api_lower_bound()",
             ppVar3 + (ppVar4->first < 0x22) + (ppVar3[ppVar4->first < 0x22].first < 0x22) == ppVar2
            );
  ppVar4 = ppVar5;
  ppVar3 = (pair<int,_int> *)&cStack_78;
  if (cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first < 0x2c) {
    ppVar4 = ppVar2;
    ppVar3 = ppVar1;
  }
  boost::detail::test_impl
            ("map.lower_bound(44) == map.begin() + 3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x7f,"void api_suite::api_lower_bound()",
             ppVar3 + (ppVar4->first < 0x2c) + (ppVar3[ppVar4->first < 0x2c].first < 0x2c) == ppVar2
            );
  ppVar3 = (pair<int,_int> *)&cStack_78;
  if (cStack_78.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first < 0x2d) {
    ppVar5 = ppVar2;
    ppVar3 = ppVar1;
  }
  boost::detail::test_impl
            ("map.lower_bound(45) == map.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x80,"void api_suite::api_lower_bound()",
             ppVar3 + (ppVar5->first < 0x2d) + (ppVar3[ppVar5->first < 0x2d].first < 0x2d) ==
             &local_58);
  return;
}

Assistant:

void api_lower_bound()
{
    auto map = make_constant_map<int, int>(
        {
            { 22, 2 },
            { 44, 4 },
            { 33, 3 },
            { 11, 1 }
        });
    BOOST_TEST(map.lower_bound(10) == map.begin());
    BOOST_TEST(map.lower_bound(11) == map.begin());
    BOOST_TEST(map.lower_bound(12) == map.begin() + 1);
    BOOST_TEST(map.lower_bound(22) == map.begin() + 1);
    BOOST_TEST(map.lower_bound(23) == map.begin() + 2);
    BOOST_TEST(map.lower_bound(33) == map.begin() + 2);
    BOOST_TEST(map.lower_bound(34) == map.begin() + 3);
    BOOST_TEST(map.lower_bound(44) == map.begin() + 3);
    BOOST_TEST(map.lower_bound(45) == map.end());
}